

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrPrint.c
# Opt level: O1

void Rwr_NodePrint(FILE *pFile,Rwr_Man_t *p,Rwr_Node_t *pNode)

{
  uint uTruth;
  uint local_1c;
  
  fprintf((FILE *)pFile,"%5d : ",(ulong)(uint)pNode->Id);
  local_1c = (uint)*(ushort *)&pNode->field_0xe;
  Extra_PrintHex(pFile,&local_1c,4);
  fwrite(" tt=",4,1,(FILE *)pFile);
  Extra_PrintBinary(pFile,&local_1c,0x10);
  fprintf((FILE *)pFile," lev=%d",(ulong)((byte)pNode->field_0x11 & 0x3f));
  fprintf((FILE *)pFile," vol=%d",(ulong)(byte)pNode->field_0x10);
  fwrite("  ",2,1,(FILE *)pFile);
  Rwr_NodePrint_rec(pFile,pNode);
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

void Rwr_NodePrint( FILE * pFile, Rwr_Man_t * p, Rwr_Node_t * pNode )
{
    unsigned uTruth;
    fprintf( pFile, "%5d : ", pNode->Id );
    uTruth = pNode->uTruth;
    Extra_PrintHex( pFile, &uTruth, 4 );
    fprintf( pFile, " tt=" );
    Extra_PrintBinary( pFile, &uTruth, 16 );
//    fprintf( pFile, " cn=", pNode->Id );
//    uTruth = p->puCanons[pNode->uTruth];
//    Extra_PrintBinary( pFile, &uTruth, 16 );
    fprintf( pFile, " lev=%d", pNode->Level );
    fprintf( pFile, " vol=%d", pNode->Volume );
    fprintf( pFile, "  " );
    Rwr_NodePrint_rec( pFile, pNode );
    fprintf( pFile, "\n" );
}